

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onHeaders
          (Connection *this,RequestConnectOrProtocolError *requestOrProtocolError)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  HttpOutputStream *pHVar1;
  PromiseAwaiter<void> *pPVar2;
  Connection *pCVar3;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *pPVar4;
  OwnPromiseNode *next;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params;
  Promise<void> *promise;
  int iVar5;
  PromiseArenaMember *pPVar6;
  long lVar7;
  _func_int **pp_Var8;
  PromiseArena *pPVar9;
  PromiseArena *pPVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  SourceLocation location;
  OwnPromiseNode OVar14;
  void *pvVar15;
  PromiseBase PVar16;
  bool bVar17;
  LoopResult LVar18;
  coroutine_handle<void> coroutine;
  undefined8 *puVar19;
  void *pvVar20;
  int *in_RDX;
  FixVoid<kj::HttpServer::Connection::LoopResult> *value;
  FixVoid<kj::HttpServer::Connection::LoopResult> FVar21;
  int iVar22;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_errorHandler local_8a;
  IdentityFunc<void> local_89;
  AttachmentPromiseNodeBase *local_88;
  OwnPromiseNode local_80;
  OwnPromiseNode local_78;
  void *local_70;
  SourceLocation local_68;
  PromiseArena *local_50;
  ExceptionOrValue *local_48;
  PromiseBase local_40;
  PromiseArenaMember *local_38;
  
  coroutine._M_fr_ptr = operator_new(0xd00);
  *(code **)coroutine._M_fr_ptr = onHeaders;
  *(code **)((long)coroutine._M_fr_ptr + 8) = onHeaders;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x10);
  *(int **)((long)coroutine._M_fr_ptr + 0xce0) = in_RDX;
  *(RequestConnectOrProtocolError **)((long)coroutine._M_fr_ptr + 0xcd8) = requestOrProtocolError;
  local_68.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_68.function = "onHeaders";
  local_68.lineNumber = 0x1dae;
  local_68.columnNumber = 0x1b;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642758;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006427a0;
  local_48 = (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98);
  location.function = "onHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1dae;
  location.columnNumber = 0x1b;
  local_70 = coroutine._M_fr_ptr;
  kj::_::CoroutineBase::CoroutineBase((CoroutineBase *)this_00,coroutine,local_48,location);
  pvVar15 = local_70;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642758;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006427a0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_Response)._vptr_Response = (_func_int **)this_00;
  if (requestOrProtocolError[5].field_1.space[0x18] == '\0') {
    if (requestOrProtocolError[5].field_1.space[0x19] != '\x01') {
      iVar5 = *in_RDX;
      if (iVar5 == 1) {
        pCVar3 = (Connection *)((long)local_70 + 0xcc0);
        onRequest(pCVar3,(Request *)requestOrProtocolError);
        pPVar4 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0xad0);
        co_await<kj::HttpServer::Connection::LoopResult>
                  (pPVar4,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar3);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xcfc) = 3;
        bVar17 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
        if (bVar17) {
          return (PromiseBase)(PromiseBase)this;
        }
        LVar18 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar4)
        ;
        *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0xce8) = LVar18;
        kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                  (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                           ((long)pvVar15 + 0xce8));
        if (*(char *)((long)coroutine._M_fr_ptr + 0xae8) == '\x01') {
          Exception::~Exception((Exception *)((long)pvVar15 + 0xaf0));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar4);
        pPVar6 = (PromiseArenaMember *)(pCVar3->super_Response)._vptr_Response;
        iVar22 = 3;
        if (pPVar6 != (PromiseArenaMember *)0x0) {
          (pCVar3->super_Response)._vptr_Response = (_func_int **)0x0;
          kj::_::PromiseDisposer::dispose(pPVar6);
        }
      }
      else if (iVar5 == 3) {
        if (in_RDX[2] == 0x1af) {
          puVar19 = (undefined8 *)operator_new(8);
          local_68.function = (char *)((long)pvVar15 + 0xc88);
          *puVar19 = &PTR_write_0063e9a0;
          *(undefined8 **)((long)coroutine._M_fr_ptr + 0xc88) =
               &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>::instance
          ;
          *(undefined8 **)((long)coroutine._M_fr_ptr + 0xc90) = puVar19;
          local_68.fileName = (char *)requestOrProtocolError;
          evalNow<kj::HttpServer::Connection::onHeaders(kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>&&)::_lambda()_1_>
                    ((kj *)&local_80,(anon_class_16_2_f7b14595 *)&local_68);
          local_40.node.ptr =
               (OwnPromiseNode)
               kj::_::
               TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7643:21)>
               ::anon_class_1_0_00000001_for_errorHandler::operator();
          kj::_::PromiseDisposer::
          appendPromise<kj::_::TransformPromiseNode<void,kj::_::IdentityFunc<void>,kj::HttpServer::Connection::onHeaders(kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>&&)::_lambda(kj::Exception&&)_1_>,kj::_::PromiseDisposer,kj::_::IdentityFunc<void>,kj::HttpServer::Connection::onHeaders(kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>&&)::_lambda(kj::Exception&&)_1_,void*&>
                    ((PromiseDisposer *)&local_38,&local_80,&local_89,&local_8a,(void **)&local_40);
          local_78.ptr = (PromiseNode *)local_38;
          pp_Var8 = *(_func_int ***)((long)coroutine._M_fr_ptr + 0xc88);
          pPVar9 = *(PromiseArena **)((long)coroutine._M_fr_ptr + 0xc90);
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0xc90) = 0;
          pPVar10 = local_38->arena;
          if (pPVar10 == (PromiseArena *)0x0 || (ulong)((long)local_38 - (long)pPVar10) < 0x28) {
            pvVar20 = operator_new(0x400);
            local_88 = (AttachmentPromiseNodeBase *)((long)pvVar20 + 0x3d8);
            kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(local_88,&local_78);
            *(undefined ***)((long)pvVar20 + 0x3d8) = &PTR_destroy_0063f0f0;
            *(_func_int ***)((long)pvVar20 + 0x3f0) = pp_Var8;
            *(PromiseArena **)((long)pvVar20 + 0x3f8) = pPVar9;
            *(void **)((long)pvVar20 + 0x3e0) = pvVar20;
          }
          else {
            local_38->arena = (PromiseArena *)0x0;
            local_88 = (AttachmentPromiseNodeBase *)&local_38[-3].arena;
            local_50 = pPVar10;
            kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(local_88,&local_78);
            local_38[-3].arena = (PromiseArena *)&PTR_destroy_0063f0f0;
            local_38[-1]._vptr_PromiseArenaMember = pp_Var8;
            local_38[-1].arena = pPVar9;
            local_38[-2]._vptr_PromiseArenaMember = (_func_int **)local_50;
          }
          OVar14.ptr = local_78.ptr;
          next = (OwnPromiseNode *)((long)pvVar15 + 0xcc8);
          next->ptr = &local_88->super_PromiseNode;
          if (&(local_78.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
            local_78.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar14.ptr)->super_PromiseArenaMember);
          }
          OVar14.ptr = local_80.ptr;
          if (&(local_80.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
            local_80.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar14.ptr)->super_PromiseArenaMember);
          }
          params = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)pvVar15 + 0xcd0);
          lVar7 = *(long *)((long)&requestOrProtocolError->field_1 + 0x10);
          plVar11 = *(long **)(lVar7 + 8);
          (**(code **)(*plVar11 + 0x10))(params,plVar11,*(undefined8 *)(lVar7 + 0x40));
          pPVar2 = (PromiseAwaiter<void> *)((long)pvVar15 + 0x3f0);
          promise = (Promise<void> *)((long)pvVar15 + 0xca0);
          local_68.fileName =
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
          ;
          local_68.function = "onHeaders";
          local_68.lineNumber = 0x1dde;
          local_68.columnNumber = 0x14;
          local_88 = (AttachmentPromiseNodeBase *)params;
          kj::_::PromiseDisposer::
          appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                    ((PromiseDisposer *)&local_40,next,params,&local_68);
          PVar16.node.ptr = local_40.node.ptr;
          local_40.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
          (promise->super_PromiseBase).node.ptr = (PromiseNode *)PVar16.node.ptr;
          co_await<void>(pPVar2,promise);
          *(undefined1 *)((long)coroutine._M_fr_ptr + 0xcfc) = 4;
          bVar17 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                             ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
          if (bVar17) {
            return (PromiseBase)(PromiseBase)this;
          }
          kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
          if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
            Exception::~Exception((Exception *)((long)pvVar15 + 0x410));
          }
          kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
          pPVar6 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
          if (pPVar6 != (PromiseArenaMember *)0x0) {
            (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(pPVar6);
          }
          pPVar6 = *(PromiseArenaMember **)&local_88->super_PromiseNode;
          if (pPVar6 != (PromiseArenaMember *)0x0) {
            *(PromiseNode **)&local_88->super_PromiseNode = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(pPVar6);
          }
          pPVar6 = &next->ptr->super_PromiseArenaMember;
          if (pPVar6 != (PromiseArenaMember *)0x0) {
            next->ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(pPVar6);
          }
          plVar11 = *(long **)((long)coroutine._M_fr_ptr + 0xc90);
          if (plVar11 != (long *)0x0) {
            *(undefined8 *)((long)coroutine._M_fr_ptr + 0xc90) = 0;
            (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xc88))
                      (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xc88),
                       (long)plVar11 + *(long *)(*plVar11 + -0x10));
          }
        }
        pCVar3 = (Connection *)((long)pvVar15 + 0xc98);
        lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0xcd8);
        if (*(char *)(lVar7 + 0x148) == '\x01') {
          *(undefined1 *)(lVar7 + 0x148) = 0;
          if (*(int *)(lVar7 + 0x150) == 1) {
            *(undefined4 *)(lVar7 + 0x150) = 0;
          }
          if (*(int *)(lVar7 + 0x150) == 2) {
            *(undefined4 *)(lVar7 + 0x150) = 0;
          }
        }
        lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0xcd8);
        lVar13 = *(long *)((long)coroutine._M_fr_ptr + 0xce0);
        *(undefined4 *)(lVar12 + 0x150) = 1;
        *(undefined4 *)(lVar12 + 0x158) = 0;
        *(undefined1 *)(lVar7 + 0x148) = 1;
        sendError(pCVar3,*(ProtocolError *)(lVar13 + 8));
        pPVar4 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0x238);
        co_await<kj::HttpServer::Connection::LoopResult>
                  (pPVar4,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar3);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xcfc) = 5;
        bVar17 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
        if (bVar17) {
          return (PromiseBase)(PromiseBase)this;
        }
        LVar18 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar4)
        ;
        *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0xcf8) = LVar18;
        kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                  (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                           ((long)pvVar15 + 0xcf8));
        if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
          Exception::~Exception((Exception *)((long)pvVar15 + 600));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar4);
        pPVar6 = (PromiseArenaMember *)(pCVar3->super_Response)._vptr_Response;
        iVar22 = 3;
        if (pPVar6 != (PromiseArenaMember *)0x0) {
          (pCVar3->super_Response)._vptr_Response = (_func_int **)0x0;
          kj::_::PromiseDisposer::dispose(pPVar6);
        }
      }
      else {
        iVar22 = 0;
        if (iVar5 == 2) {
          pCVar3 = (Connection *)((long)local_70 + 0xcb8);
          onConnect(pCVar3,(ConnectRequest *)requestOrProtocolError);
          pPVar4 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0x918)
          ;
          co_await<kj::HttpServer::Connection::LoopResult>
                    (pPVar4,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar3);
          *(undefined1 *)((long)coroutine._M_fr_ptr + 0xcfc) = 2;
          bVar17 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                             ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
          if (bVar17) {
            return (PromiseBase)(PromiseBase)this;
          }
          LVar18 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                             (pPVar4);
          *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0xcf4) = LVar18;
          kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                    (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                             ((long)pvVar15 + 0xcf4));
          if (*(char *)((long)coroutine._M_fr_ptr + 0x930) == '\x01') {
            Exception::~Exception((Exception *)((long)pvVar15 + 0x938));
          }
          kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar4);
          pPVar6 = (PromiseArenaMember *)(pCVar3->super_Response)._vptr_Response;
          iVar22 = 3;
          if (pPVar6 != (PromiseArenaMember *)0x0) {
            (pCVar3->super_Response)._vptr_Response = (_func_int **)0x0;
            kj::_::PromiseDisposer::dispose(pPVar6);
          }
        }
      }
      if (iVar22 != 3) {
        if (iVar22 != 0) {
          if ((local_48->exception).ptr.isSet == true) {
            Exception::~Exception((Exception *)((long)local_70 + 0xa0));
          }
          kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
          operator_delete(coroutine._M_fr_ptr,0xd00);
          return (PromiseBase)(PromiseBase)this;
        }
        kj::_::unreachable();
      }
      goto LAB_003f6339;
    }
    pHVar1 = (HttpOutputStream *)((long)local_70 + 0xcb0);
    anon_unknown_36::HttpOutputStream::flush(pHVar1);
    pPVar2 = (PromiseAwaiter<void> *)((long)pvVar15 + 0x760);
    co_await<void>(pPVar2,(Promise<void> *)pHVar1);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0xcfc) = 1;
    bVar17 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
    if (bVar17) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x778) == '\x01') {
      Exception::~Exception((Exception *)((long)pvVar15 + 0x780));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
    pPVar6 = (PromiseArenaMember *)
             (pHVar1->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
             currentWrapper.ptr;
    if (pPVar6 != (PromiseArenaMember *)0x0) {
      (pHVar1->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
      currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar6);
    }
    value = (FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0xcf0);
    *value = BREAK_LOOP_CONN_ERR;
  }
  else {
    pHVar1 = (HttpOutputStream *)((long)local_70 + 0xca8);
    anon_unknown_36::HttpOutputStream::flush(pHVar1);
    pPVar2 = (PromiseAwaiter<void> *)((long)pvVar15 + 0x5a8);
    co_await<void>(pPVar2,(Promise<void> *)pHVar1);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0xcfc) = 0;
    bVar17 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
    if (bVar17) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x5c0) == '\x01') {
      Exception::~Exception((Exception *)((long)pvVar15 + 0x5c8));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
    pPVar6 = (PromiseArenaMember *)
             (pHVar1->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
             currentWrapper.ptr;
    if (pPVar6 != (PromiseArenaMember *)0x0) {
      (pHVar1->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
      currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar6);
    }
    value = (FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)pvVar15 + 0xcec);
    lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0xcd8);
    FVar21 = BREAK_LOOP_CONN_ERR;
    if (((*(char *)(*(long *)(lVar7 + 0x18) + 0x70) == '\x01') && (*(long *)(lVar7 + 0x118) == 0))
       && (anon_unknown_36::HttpInputStreamImpl::snarfBufferedLineBreak
                     ((HttpInputStreamImpl *)(lVar7 + 0x38)), *(char *)(lVar7 + 0x108) == '\0')) {
      FVar21 = BREAK_LOOP_CONN_ERR -
               (*(long *)(*(long *)((long)coroutine._M_fr_ptr + 0xcd8) + 0x78) == 0);
    }
    *value = FVar21;
  }
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill(this_00,value);
LAB_003f6339:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0xcfc) = 6;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> onHeaders(HttpHeaders::RequestConnectOrProtocolError&& requestOrProtocolError) {
    if (timedOut) {
      // Client took too long to send anything, so we're going to close the connection. In
      // theory, we should send back an HTTP 408 error -- it is designed exactly for this
      // purpose. Alas, in practice, Google Chrome does not have any special handling for 408
      // errors -- it will assume the error is a response to the next request it tries to send,
      // and will happily serve the error to the user. OTOH, if we simply close the connection,
      // Chrome does the "right thing", apparently. (Though I'm not sure what happens if a
      // request is in-flight when we close... if it's a GET, the browser should retry. But if
      // it's a POST, retrying may be dangerous. This is why 408 exists -- it unambiguously
      // tells the client that it should retry.)
      //
      // Also note that if we ever decide to send 408 again, we might want to send some other
      // error in the case that the server is draining, which also sets timedOut = true; see
      // above.

      co_await httpOutput.flush();
      co_return (server.draining && httpInput.isCleanDrain()) ? BREAK_LOOP_CONN_OK : BREAK_LOOP_CONN_ERR;
    }

    if (closed) {
      // Client closed connection. Close our end too.
      co_await httpOutput.flush();
      co_return BREAK_LOOP_CONN_ERR;
    }

    KJ_SWITCH_ONEOF(requestOrProtocolError) {
      KJ_CASE_ONEOF(request, HttpHeaders::ConnectRequest) {
        co_return co_await onConnect(request);
      }
      KJ_CASE_ONEOF(request, HttpHeaders::Request) {
        co_return co_await onRequest(request);
      }
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        // Bad request.

        auto needClientGrace = protocolError.statusCode == 431;
        if (needClientGrace) {
          // We're going to reply with an error and close the connection.
          // The client might not be able to read the error back. Read some data and wait
          // a bit to give client a chance to finish writing.

          auto dummy = kj::heap<HttpDiscardingEntityWriter>();
          auto lengthGrace = kj::evalNow([&]() {
            return httpInput.discard(*dummy, server.settings.canceledUploadGraceBytes);
          }).catch_([](kj::Exception&& e) -> void { })
            .attach(kj::mv(dummy));
          auto timeGrace = server.timer.afterDelay(server.settings.canceledUploadGracePeriod);
          co_await lengthGrace.exclusiveJoin(kj::mv(timeGrace));
        }

        // sendError() uses Response::send(), which requires that we have a currentMethod, but we
        // never read one. GET seems like the correct choice here.
        currentMethod = HttpMethod::GET;
        co_return co_await sendError(kj::mv(protocolError));
      }
    }

    KJ_UNREACHABLE;
  }